

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O2

Abc_TtStore_t * Abc_TruthStoreAlloc(int nVars,int nFuncs)

{
  Abc_TtStore_t *pAVar1;
  word **ppwVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  pAVar1 = (Abc_TtStore_t *)malloc(0x18);
  iVar4 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar4 = 1;
  }
  pAVar1->nVars = nVars;
  pAVar1->nWords = iVar4;
  pAVar1->nFuncs = nFuncs;
  lVar6 = (long)iVar4;
  lVar5 = (long)nFuncs;
  ppwVar2 = (word **)malloc((lVar6 * 8 + 8) * lVar5);
  pAVar1->pFuncs = ppwVar2;
  *ppwVar2 = (word *)(ppwVar2 + lVar5);
  memset(ppwVar2 + lVar5,0,lVar6 * 8 * lVar5);
  for (lVar3 = 1; lVar3 < lVar5; lVar3 = lVar3 + 1) {
    ppwVar2[lVar3] = ppwVar2[lVar3 + -1] + lVar6;
  }
  return pAVar1;
}

Assistant:

Abc_TtStore_t * Abc_TruthStoreAlloc( int nVars, int nFuncs )
{
    Abc_TtStore_t * p;
    int i;
    p = (Abc_TtStore_t *)malloc( sizeof(Abc_TtStore_t) );
    p->nVars  =  nVars;
    p->nWords = (nVars < 7) ? 1 : (1 << (nVars-6));
    p->nFuncs =  nFuncs;
    // alloc storage for 'nFuncs' truth tables as one chunk of memory
    p->pFuncs = (word **)malloc( (sizeof(word *) + sizeof(word) * p->nWords) * p->nFuncs );
    // assign and clean the truth table storage
    p->pFuncs[0] = (word *)(p->pFuncs + p->nFuncs);
    memset( p->pFuncs[0], 0, sizeof(word) * p->nWords * p->nFuncs );
    // split it up into individual truth tables
    for ( i = 1; i < p->nFuncs; i++ )
        p->pFuncs[i] = p->pFuncs[i-1] + p->nWords;
    return p;
}